

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O2

void __thiscall
hashset<hashtableentry<char_*,_int>_>::hashset(hashset<hashtableentry<char_*,_int>_> *this,int size)

{
  chain **ppcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->size = size;
  this->numelems = 0;
  this->chunks = (chainchunk *)0x0;
  this->unused = (chain *)0x0;
  uVar4 = 0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar3 = (ulong)(uint)size << 3;
  }
  uVar2 = (ulong)(uint)size;
  if (size < 1) {
    uVar2 = uVar4;
  }
  ppcVar1 = (chain **)operator_new__(uVar3);
  this->chains = ppcVar1;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    this->chains[uVar4] = (chain *)0x0;
  }
  return;
}

Assistant:

hashset(int size = 1<<10)
    : size(size)
    {
        numelems = 0;
        chunks = NULL;
        unused = NULL;
        chains = new chain *[size];
        loopi(size) chains[i] = NULL;
    }